

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# frobtadsapp.cc
# Opt level: O3

void __thiscall
FrobTadsApplication::FrobTadsApplication(FrobTadsApplication *this,FrobOptions *opts)

{
  pointer pcVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  uint uVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  int iVar10;
  int iVar11;
  bool bVar12;
  bool bVar13;
  bool bVar14;
  bool bVar15;
  bool bVar16;
  undefined2 uVar17;
  
  this->_vptr_FrobTadsApplication = (_func_int **)&PTR___cxa_pure_virtual_003496d0;
  bVar12 = opts->forceColors;
  bVar13 = opts->defColors;
  bVar14 = opts->softScroll;
  bVar15 = opts->exitPause;
  bVar16 = opts->changeDir;
  uVar17 = *(undefined2 *)&opts->field_0x6;
  iVar2 = opts->textColor;
  iVar3 = opts->bgColor;
  iVar4 = opts->statTextColor;
  iVar5 = opts->statBgColor;
  uVar6 = opts->scrollBufSize;
  iVar7 = opts->safetyLevelR;
  iVar8 = opts->safetyLevelR;
  iVar9 = opts->safetyLevelW;
  iVar10 = opts->netSafetyLevelC;
  iVar11 = opts->netSafetyLevelS;
  (this->options).useColors = opts->useColors;
  (this->options).forceColors = bVar12;
  (this->options).defColors = bVar13;
  (this->options).softScroll = bVar14;
  (this->options).exitPause = bVar15;
  (this->options).changeDir = bVar16;
  *(undefined2 *)&(this->options).field_0x6 = uVar17;
  (this->options).textColor = iVar2;
  (this->options).bgColor = iVar3;
  (this->options).statTextColor = iVar4;
  (this->options).statBgColor = iVar5;
  (this->options).scrollBufSize = uVar6;
  (this->options).safetyLevelR = iVar7;
  (this->options).safetyLevelR = iVar8;
  (this->options).safetyLevelW = iVar9;
  (this->options).netSafetyLevelC = iVar10;
  (this->options).netSafetyLevelS = iVar11;
  (this->options).characterSet._M_dataplus._M_p = (pointer)&(this->options).characterSet.field_2;
  pcVar1 = (opts->characterSet)._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&(this->options).characterSet,pcVar1,
             pcVar1 + (opts->characterSet)._M_string_length);
  (this->options).replayFile._M_dataplus._M_p = (pointer)&(this->options).replayFile.field_2;
  pcVar1 = (opts->replayFile)._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&(this->options).replayFile,pcVar1,
             pcVar1 + (opts->replayFile)._M_string_length);
  (this->options).cmdLogFile._M_dataplus._M_p = (pointer)&(this->options).cmdLogFile.field_2;
  pcVar1 = (opts->cmdLogFile)._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&(this->options).cmdLogFile,pcVar1,
             pcVar1 + (opts->cmdLogFile)._M_string_length);
  (this->options).seedRand = opts->seedRand;
  this->fRemainingTimeout = 0;
  this->fColorsEnabled = false;
  globalApp = this;
  signal(0x1c,winResizeHandler);
  return;
}

Assistant:

FrobTadsApplication::FrobTadsApplication( const FrobOptions& opts )
: options(opts), fRemainingTimeout(0), fColorsEnabled(false)
{
    // Initialize the global pointer to us.
    globalApp = this;

    // Install our window-resize signal handler.
#if HAVE_SIGWINCH
    signal(SIGWINCH, winResizeHandler);
#endif
}